

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

void embree::avx512::DiscMiMBIntersectorK<4,_16,_true>::intersect
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Scene *pSVar8;
  Geometry *pGVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  byte bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined1 auVar34 [16];
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  uint uVar50;
  ulong uVar51;
  uint uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  uint uVar56;
  long lVar57;
  byte bVar58;
  uint uVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [32];
  undefined1 auVar82 [64];
  undefined4 uVar83;
  float fVar84;
  float fVar86;
  float fVar87;
  undefined1 auVar85 [16];
  float fVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  RTCFilterFunctionNArguments local_400;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [16];
  float local_390 [4];
  float local_380 [4];
  float local_370 [8];
  undefined1 local_350 [16];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar78 [64];
  
  pSVar8 = context->scene;
  pGVar9 = (pSVar8->geometries).items[Disc->sharedGeomID].ptr;
  fVar1 = (pGVar9->time_range).lower;
  uVar51 = (ulong)(Disc->primIDs).field_0.i[0];
  fVar29 = pGVar9->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x1c0) - fVar1) / ((pGVar9->time_range).upper - fVar1));
  auVar66 = vroundss_avx(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29),9);
  auVar66 = vminss_avx(auVar66,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar60 = vmaxss_avx(ZEXT816(0) << 0x20,auVar66);
  lVar10 = *(long *)&pGVar9[2].numPrimitives;
  lVar57 = (long)(int)auVar60._0_4_ * 0x38;
  lVar11 = *(long *)(lVar10 + lVar57);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar57);
  auVar66 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar51);
  uVar53 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar64 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar53);
  uVar54 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar61 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar54);
  uVar55 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar72 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar55);
  lVar11 = *(long *)(lVar10 + 0x38 + lVar57);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar57);
  auVar74 = *(undefined1 (*) [16])(lVar11 + uVar51 * lVar10);
  auVar6 = *(undefined1 (*) [16])(lVar11 + uVar53 * lVar10);
  auVar63 = *(undefined1 (*) [16])(lVar11 + uVar54 * lVar10);
  auVar7 = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar55);
  fVar29 = fVar29 - auVar60._0_4_;
  auVar60 = vunpcklps_avx(auVar66,auVar61);
  auVar66 = vunpckhps_avx(auVar66,auVar61);
  auVar61 = vunpcklps_avx(auVar64,auVar72);
  auVar64 = vunpckhps_avx(auVar64,auVar72);
  auVar30 = vunpcklps_avx(auVar60,auVar61);
  auVar61 = vunpckhps_avx(auVar60,auVar61);
  auVar60 = vunpcklps_avx(auVar66,auVar64);
  auVar62 = vunpcklps_avx(auVar74,auVar63);
  auVar72 = vunpckhps_avx(auVar74,auVar63);
  auVar63 = vunpcklps_avx(auVar6,auVar7);
  auVar74 = vunpckhps_avx(auVar6,auVar7);
  auVar7 = vunpcklps_avx(auVar62,auVar63);
  auVar6 = vunpckhps_avx(auVar62,auVar63);
  auVar63 = vunpcklps_avx(auVar72,auVar74);
  fVar1 = 1.0 - fVar29;
  auVar79._4_4_ = fVar1;
  auVar79._0_4_ = fVar1;
  auVar79._8_4_ = fVar1;
  auVar79._12_4_ = fVar1;
  auVar62._0_4_ = auVar7._0_4_ * fVar29;
  auVar62._4_4_ = auVar7._4_4_ * fVar29;
  auVar62._8_4_ = auVar7._8_4_ * fVar29;
  auVar62._12_4_ = auVar7._12_4_ * fVar29;
  auVar85._0_4_ = auVar6._0_4_ * fVar29;
  auVar85._4_4_ = auVar6._4_4_ * fVar29;
  auVar85._8_4_ = auVar6._8_4_ * fVar29;
  auVar85._12_4_ = auVar6._12_4_ * fVar29;
  auVar89._0_4_ = auVar63._0_4_ * fVar29;
  auVar89._4_4_ = auVar63._4_4_ * fVar29;
  auVar89._8_4_ = auVar63._8_4_ * fVar29;
  auVar89._12_4_ = auVar63._12_4_ * fVar29;
  auVar6 = vfmadd231ps_fma(auVar62,auVar79,auVar30);
  auVar63 = vfmadd231ps_fma(auVar85,auVar79,auVar61);
  auVar7 = vfmadd231ps_fma(auVar89,auVar79,auVar60);
  local_350 = vpbroadcastd_avx512vl();
  fVar1 = *(float *)(ray + k * 4 + 0x100);
  auVar70._4_4_ = fVar1;
  auVar70._0_4_ = fVar1;
  auVar70._8_4_ = fVar1;
  auVar70._12_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x140);
  auVar71._4_4_ = fVar2;
  auVar71._0_4_ = fVar2;
  auVar71._8_4_ = fVar2;
  auVar71._12_4_ = fVar2;
  fVar3 = *(float *)(ray + k * 4 + 0x180);
  auVar61 = vfmadd231ps_fma(ZEXT416((uint)(fVar3 * fVar3)),auVar71,auVar71);
  auVar61 = vfmadd231ps_fma(auVar61,auVar70,auVar70);
  uVar83 = auVar61._0_4_;
  auVar91._4_4_ = uVar83;
  auVar91._0_4_ = uVar83;
  auVar91._8_4_ = uVar83;
  auVar91._12_4_ = uVar83;
  auVar60 = vrcp14ps_avx512vl(auVar91);
  auVar61._8_4_ = 0x3f800000;
  auVar61._0_8_ = &DAT_3f8000003f800000;
  auVar61._12_4_ = 0x3f800000;
  auVar61 = vfnmadd213ps_avx512vl(auVar91,auVar60,auVar61);
  auVar61 = vfmadd132ps_fma(auVar61,auVar60,auVar60);
  uVar83 = *(undefined4 *)(ray + k * 4);
  auVar60._4_4_ = uVar83;
  auVar60._0_4_ = uVar83;
  auVar60._8_4_ = uVar83;
  auVar60._12_4_ = uVar83;
  auVar60 = vsubps_avx512vl(auVar6,auVar60);
  uVar83 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar6._4_4_ = uVar83;
  auVar6._0_4_ = uVar83;
  auVar6._8_4_ = uVar83;
  auVar6._12_4_ = uVar83;
  auVar62 = vsubps_avx512vl(auVar63,auVar6);
  uVar83 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar63._4_4_ = uVar83;
  auVar63._0_4_ = uVar83;
  auVar63._8_4_ = uVar83;
  auVar63._12_4_ = uVar83;
  auVar63 = vsubps_avx512vl(auVar7,auVar63);
  fVar84 = auVar63._0_4_;
  auVar90._0_4_ = fVar84 * fVar3;
  fVar86 = auVar63._4_4_;
  auVar90._4_4_ = fVar86 * fVar3;
  fVar87 = auVar63._8_4_;
  auVar90._8_4_ = fVar87 * fVar3;
  fVar88 = auVar63._12_4_;
  auVar90._12_4_ = fVar88 * fVar3;
  auVar6 = vfmadd231ps_fma(auVar90,auVar62,auVar71);
  auVar6 = vfmadd231ps_fma(auVar6,auVar60,auVar70);
  local_3a0._0_4_ = auVar6._0_4_ * auVar61._0_4_;
  local_3a0._4_4_ = auVar6._4_4_ * auVar61._4_4_;
  local_3a0._8_4_ = auVar6._8_4_ * auVar61._8_4_;
  local_3a0._12_4_ = auVar6._12_4_ * auVar61._12_4_;
  auVar92 = ZEXT1664(local_3a0);
  uVar83 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar7._4_4_ = uVar83;
  auVar7._0_4_ = uVar83;
  auVar7._8_4_ = uVar83;
  auVar7._12_4_ = uVar83;
  uVar31 = vcmpps_avx512vl(local_3a0,auVar7,2);
  auVar61 = vpbroadcastd_avx512vl();
  uVar83 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar30._4_4_ = uVar83;
  auVar30._0_4_ = uVar83;
  auVar30._8_4_ = uVar83;
  auVar30._12_4_ = uVar83;
  uVar32 = vcmpps_avx512vl(local_3a0,auVar30,0xd);
  uVar33 = vpcmpgtd_avx512vl(auVar61,_DAT_01ff0cf0);
  bVar58 = (byte)uVar31 & (byte)uVar32 & 0xf & (byte)uVar33;
  if (bVar58 != 0) {
    auVar66 = vunpckhps_avx(auVar66,auVar64);
    auVar64 = vunpckhps_avx(auVar72,auVar74);
    auVar72._0_4_ = fVar29 * auVar64._0_4_;
    auVar72._4_4_ = fVar29 * auVar64._4_4_;
    auVar72._8_4_ = fVar29 * auVar64._8_4_;
    auVar72._12_4_ = fVar29 * auVar64._12_4_;
    auVar72 = vfmadd231ps_fma(auVar72,auVar79,auVar66);
    auVar66._0_4_ = local_3a0._0_4_ * fVar1;
    auVar66._4_4_ = local_3a0._4_4_ * fVar1;
    auVar66._8_4_ = local_3a0._8_4_ * fVar1;
    auVar66._12_4_ = local_3a0._12_4_ * fVar1;
    auVar74._0_4_ = local_3a0._0_4_ * fVar2;
    auVar74._4_4_ = local_3a0._4_4_ * fVar2;
    auVar74._8_4_ = local_3a0._8_4_ * fVar2;
    auVar74._12_4_ = local_3a0._12_4_ * fVar2;
    auVar75._0_4_ = local_3a0._0_4_ * fVar3;
    auVar75._4_4_ = local_3a0._4_4_ * fVar3;
    auVar75._8_4_ = local_3a0._8_4_ * fVar3;
    auVar75._12_4_ = local_3a0._12_4_ * fVar3;
    auVar66 = vsubps_avx(auVar60,auVar66);
    auVar64 = vsubps_avx(auVar62,auVar74);
    auVar61 = vsubps_avx(auVar63,auVar75);
    auVar76._0_4_ = auVar61._0_4_ * auVar61._0_4_;
    auVar76._4_4_ = auVar61._4_4_ * auVar61._4_4_;
    auVar76._8_4_ = auVar61._8_4_ * auVar61._8_4_;
    auVar76._12_4_ = auVar61._12_4_ * auVar61._12_4_;
    auVar64 = vfmadd231ps_fma(auVar76,auVar64,auVar64);
    auVar66 = vfmadd231ps_fma(auVar64,auVar66,auVar66);
    auVar64._0_4_ = auVar72._0_4_ * auVar72._0_4_;
    auVar64._4_4_ = auVar72._4_4_ * auVar72._4_4_;
    auVar64._8_4_ = auVar72._8_4_ * auVar72._8_4_;
    auVar64._12_4_ = auVar72._12_4_ * auVar72._12_4_;
    uVar31 = vcmpps_avx512vl(auVar66,auVar64,2);
    bVar58 = (byte)uVar31 & bVar58;
    if (bVar58 != 0) {
      auVar73._0_4_ = fVar84 * fVar84;
      auVar73._4_4_ = fVar86 * fVar86;
      auVar73._8_4_ = fVar87 * fVar87;
      auVar73._12_4_ = fVar88 * fVar88;
      auVar66 = vfmadd213ps_fma(auVar62,auVar62,auVar73);
      auVar66 = vfmadd213ps_fma(auVar60,auVar60,auVar66);
      uVar31 = vcmpps_avx512vl(auVar66,auVar64,6);
      bVar58 = bVar58 & (byte)uVar31;
      uVar59 = (uint)bVar58;
      if (bVar58 != 0) {
        local_3c0 = ZEXT432(0) << 0x20;
        local_390[0] = -fVar1;
        local_390[1] = -fVar1;
        local_390[2] = -fVar1;
        local_390[3] = -fVar1;
        local_380[0] = -fVar2;
        local_380[1] = -fVar2;
        local_380[2] = -fVar2;
        local_380[3] = -fVar2;
        local_370[0] = -fVar3;
        local_370[1] = -fVar3;
        local_370[2] = -fVar3;
        local_370[3] = -fVar3;
        auVar77._8_4_ = 0x7f800000;
        auVar77._0_8_ = 0x7f8000007f800000;
        auVar77._12_4_ = 0x7f800000;
        auVar78 = ZEXT1664(auVar77);
        auVar64 = vblendmps_avx512vl(auVar77,local_3a0);
        auVar65._0_4_ = (uint)(bVar58 & 1) * auVar64._0_4_ | (uint)!(bool)(bVar58 & 1) * (int)-fVar3
        ;
        bVar14 = (bool)(bVar58 >> 1 & 1);
        auVar65._4_4_ = (uint)bVar14 * auVar64._4_4_ | (uint)!bVar14 * (int)-fVar3;
        bVar14 = (bool)(bVar58 >> 2 & 1);
        auVar65._8_4_ = (uint)bVar14 * auVar64._8_4_ | (uint)!bVar14 * (int)-fVar3;
        auVar65._12_4_ =
             (uint)(bVar58 >> 3) * auVar64._12_4_ | (uint)!(bool)(bVar58 >> 3) * (int)-fVar3;
        auVar64 = vshufps_avx(auVar65,auVar65,0xb1);
        auVar64 = vminps_avx(auVar64,auVar65);
        auVar61 = vshufpd_avx(auVar64,auVar64,1);
        auVar64 = vminps_avx(auVar61,auVar64);
        uVar31 = vcmpps_avx512vl(auVar65,auVar64,0);
        uVar52 = uVar59;
        if (((byte)uVar31 & bVar58) != 0) {
          uVar52 = (uint)((byte)uVar31 & bVar58);
        }
        uVar50 = 0;
        for (; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x80000000) {
          uVar50 = uVar50 + 1;
        }
        auVar80 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
        auVar81 = vpcmpeqd_avx2(ZEXT1632(auVar66),ZEXT1632(auVar66));
        auVar82 = ZEXT3264(auVar81);
        do {
          local_400.valid = (int *)local_340;
          uVar56 = uVar50 & 0xff;
          uVar52 = *(uint *)(local_350 + (ulong)uVar56 * 4);
          pGVar9 = (pSVar8->geometries).items[uVar52].ptr;
          if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
            bVar58 = ~(byte)(1 << (uVar50 & 0x1f)) & (byte)uVar59;
LAB_01bd3de7:
            uVar59 = (uint)bVar58;
            bVar14 = true;
          }
          else {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              uVar51 = (ulong)(uVar56 * 4);
              local_200 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_3c0 + uVar51)));
              local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_3c0 + uVar51 + 0x10)));
              auVar68 = vpbroadcastd_avx512f();
              local_180 = vbroadcastss_avx512f
                                    (ZEXT416(*(uint *)((long)&(Disc->primIDs).field_0 + uVar51)));
              auVar69 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_390 + uVar51)));
              local_280 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_380 + uVar51)));
              local_240 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_370 + uVar51)));
              local_2c0[0] = (RTCHitN)auVar69[0];
              local_2c0[1] = (RTCHitN)auVar69[1];
              local_2c0[2] = (RTCHitN)auVar69[2];
              local_2c0[3] = (RTCHitN)auVar69[3];
              local_2c0[4] = (RTCHitN)auVar69[4];
              local_2c0[5] = (RTCHitN)auVar69[5];
              local_2c0[6] = (RTCHitN)auVar69[6];
              local_2c0[7] = (RTCHitN)auVar69[7];
              local_2c0[8] = (RTCHitN)auVar69[8];
              local_2c0[9] = (RTCHitN)auVar69[9];
              local_2c0[10] = (RTCHitN)auVar69[10];
              local_2c0[0xb] = (RTCHitN)auVar69[0xb];
              local_2c0[0xc] = (RTCHitN)auVar69[0xc];
              local_2c0[0xd] = (RTCHitN)auVar69[0xd];
              local_2c0[0xe] = (RTCHitN)auVar69[0xe];
              local_2c0[0xf] = (RTCHitN)auVar69[0xf];
              local_2c0[0x10] = (RTCHitN)auVar69[0x10];
              local_2c0[0x11] = (RTCHitN)auVar69[0x11];
              local_2c0[0x12] = (RTCHitN)auVar69[0x12];
              local_2c0[0x13] = (RTCHitN)auVar69[0x13];
              local_2c0[0x14] = (RTCHitN)auVar69[0x14];
              local_2c0[0x15] = (RTCHitN)auVar69[0x15];
              local_2c0[0x16] = (RTCHitN)auVar69[0x16];
              local_2c0[0x17] = (RTCHitN)auVar69[0x17];
              local_2c0[0x18] = (RTCHitN)auVar69[0x18];
              local_2c0[0x19] = (RTCHitN)auVar69[0x19];
              local_2c0[0x1a] = (RTCHitN)auVar69[0x1a];
              local_2c0[0x1b] = (RTCHitN)auVar69[0x1b];
              local_2c0[0x1c] = (RTCHitN)auVar69[0x1c];
              local_2c0[0x1d] = (RTCHitN)auVar69[0x1d];
              local_2c0[0x1e] = (RTCHitN)auVar69[0x1e];
              local_2c0[0x1f] = (RTCHitN)auVar69[0x1f];
              local_2c0[0x20] = (RTCHitN)auVar69[0x20];
              local_2c0[0x21] = (RTCHitN)auVar69[0x21];
              local_2c0[0x22] = (RTCHitN)auVar69[0x22];
              local_2c0[0x23] = (RTCHitN)auVar69[0x23];
              local_2c0[0x24] = (RTCHitN)auVar69[0x24];
              local_2c0[0x25] = (RTCHitN)auVar69[0x25];
              local_2c0[0x26] = (RTCHitN)auVar69[0x26];
              local_2c0[0x27] = (RTCHitN)auVar69[0x27];
              local_2c0[0x28] = (RTCHitN)auVar69[0x28];
              local_2c0[0x29] = (RTCHitN)auVar69[0x29];
              local_2c0[0x2a] = (RTCHitN)auVar69[0x2a];
              local_2c0[0x2b] = (RTCHitN)auVar69[0x2b];
              local_2c0[0x2c] = (RTCHitN)auVar69[0x2c];
              local_2c0[0x2d] = (RTCHitN)auVar69[0x2d];
              local_2c0[0x2e] = (RTCHitN)auVar69[0x2e];
              local_2c0[0x2f] = (RTCHitN)auVar69[0x2f];
              local_2c0[0x30] = (RTCHitN)auVar69[0x30];
              local_2c0[0x31] = (RTCHitN)auVar69[0x31];
              local_2c0[0x32] = (RTCHitN)auVar69[0x32];
              local_2c0[0x33] = (RTCHitN)auVar69[0x33];
              local_2c0[0x34] = (RTCHitN)auVar69[0x34];
              local_2c0[0x35] = (RTCHitN)auVar69[0x35];
              local_2c0[0x36] = (RTCHitN)auVar69[0x36];
              local_2c0[0x37] = (RTCHitN)auVar69[0x37];
              local_2c0[0x38] = (RTCHitN)auVar69[0x38];
              local_2c0[0x39] = (RTCHitN)auVar69[0x39];
              local_2c0[0x3a] = (RTCHitN)auVar69[0x3a];
              local_2c0[0x3b] = (RTCHitN)auVar69[0x3b];
              local_2c0[0x3c] = (RTCHitN)auVar69[0x3c];
              local_2c0[0x3d] = (RTCHitN)auVar69[0x3d];
              local_2c0[0x3e] = (RTCHitN)auVar69[0x3e];
              local_2c0[0x3f] = (RTCHitN)auVar69[0x3f];
              local_140 = vmovdqa64_avx512f(auVar68);
              local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
              local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
              uVar4 = *(uint *)(ray + k * 4 + 0x200);
              *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_3a0 + uVar51);
              local_340 = vmovdqa64_avx512f(auVar80);
              local_400.geometryUserPtr = pGVar9->userPtr;
              local_400.context = context->user;
              local_400.hit = local_2c0;
              local_400.N = 0x10;
              local_3d0 = auVar92._0_16_;
              local_300 = vmovdqa64_avx512f(auVar80);
              local_400.ray = (RTCRayN *)ray;
              if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                auVar81 = ZEXT1632(auVar82._0_16_);
                (*pGVar9->intersectionFilterN)(&local_400);
                auVar81 = vpcmpeqd_avx2(auVar81,auVar81);
                auVar82 = ZEXT3264(auVar81);
                auVar80 = vmovdqa64_avx512f(local_300);
                auVar78 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar92 = ZEXT1664(local_3d0);
              }
              auVar68 = vmovdqa64_avx512f(local_340);
              uVar31 = vptestmd_avx512f(auVar68,auVar68);
              if ((short)uVar31 == 0) {
LAB_01bd40d8:
                auVar65 = ZEXT416(uVar4);
                *(uint *)(ray + k * 4 + 0x200) = uVar4;
              }
              else {
                p_Var13 = context->args->filter;
                if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0))))
                {
                  auVar81 = ZEXT1632(auVar82._0_16_);
                  (*p_Var13)(&local_400);
                  auVar81 = vpcmpeqd_avx2(auVar81,auVar81);
                  auVar82 = ZEXT3264(auVar81);
                  auVar80 = vmovdqa64_avx512f(local_300);
                  auVar78 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                  auVar92 = ZEXT1664(local_3d0);
                }
                auVar68 = vmovdqa64_avx512f(local_340);
                uVar51 = vptestmd_avx512f(auVar68,auVar68);
                if ((short)uVar51 == 0) goto LAB_01bd40d8;
                iVar35 = *(int *)(local_400.hit + 4);
                iVar36 = *(int *)(local_400.hit + 8);
                iVar37 = *(int *)(local_400.hit + 0xc);
                iVar38 = *(int *)(local_400.hit + 0x10);
                iVar39 = *(int *)(local_400.hit + 0x14);
                iVar40 = *(int *)(local_400.hit + 0x18);
                iVar41 = *(int *)(local_400.hit + 0x1c);
                iVar42 = *(int *)(local_400.hit + 0x20);
                iVar43 = *(int *)(local_400.hit + 0x24);
                iVar44 = *(int *)(local_400.hit + 0x28);
                iVar45 = *(int *)(local_400.hit + 0x2c);
                iVar46 = *(int *)(local_400.hit + 0x30);
                iVar47 = *(int *)(local_400.hit + 0x34);
                iVar48 = *(int *)(local_400.hit + 0x38);
                iVar49 = *(int *)(local_400.hit + 0x3c);
                bVar58 = (byte)uVar51;
                bVar14 = (bool)((byte)(uVar51 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar51 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar51 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar51 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar51 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar51 >> 6) & 1);
                bVar20 = (bool)((byte)(uVar51 >> 7) & 1);
                bVar21 = (byte)(uVar51 >> 8);
                bVar22 = (bool)((byte)(uVar51 >> 9) & 1);
                bVar23 = (bool)((byte)(uVar51 >> 10) & 1);
                bVar24 = (bool)((byte)(uVar51 >> 0xb) & 1);
                bVar25 = (bool)((byte)(uVar51 >> 0xc) & 1);
                bVar26 = (bool)((byte)(uVar51 >> 0xd) & 1);
                bVar27 = (bool)((byte)(uVar51 >> 0xe) & 1);
                bVar28 = SUB81(uVar51 >> 0xf,0);
                *(uint *)(local_400.ray + 0x300) =
                     (uint)(bVar58 & 1) * *(int *)local_400.hit |
                     (uint)!(bool)(bVar58 & 1) * *(int *)(local_400.ray + 0x300);
                *(uint *)(local_400.ray + 0x304) =
                     (uint)bVar14 * iVar35 | (uint)!bVar14 * *(int *)(local_400.ray + 0x304);
                *(uint *)(local_400.ray + 0x308) =
                     (uint)bVar15 * iVar36 | (uint)!bVar15 * *(int *)(local_400.ray + 0x308);
                *(uint *)(local_400.ray + 0x30c) =
                     (uint)bVar16 * iVar37 | (uint)!bVar16 * *(int *)(local_400.ray + 0x30c);
                *(uint *)(local_400.ray + 0x310) =
                     (uint)bVar17 * iVar38 | (uint)!bVar17 * *(int *)(local_400.ray + 0x310);
                *(uint *)(local_400.ray + 0x314) =
                     (uint)bVar18 * iVar39 | (uint)!bVar18 * *(int *)(local_400.ray + 0x314);
                *(uint *)(local_400.ray + 0x318) =
                     (uint)bVar19 * iVar40 | (uint)!bVar19 * *(int *)(local_400.ray + 0x318);
                *(uint *)(local_400.ray + 0x31c) =
                     (uint)bVar20 * iVar41 | (uint)!bVar20 * *(int *)(local_400.ray + 0x31c);
                *(uint *)(local_400.ray + 800) =
                     (uint)(bVar21 & 1) * iVar42 |
                     (uint)!(bool)(bVar21 & 1) * *(int *)(local_400.ray + 800);
                *(uint *)(local_400.ray + 0x324) =
                     (uint)bVar22 * iVar43 | (uint)!bVar22 * *(int *)(local_400.ray + 0x324);
                *(uint *)(local_400.ray + 0x328) =
                     (uint)bVar23 * iVar44 | (uint)!bVar23 * *(int *)(local_400.ray + 0x328);
                *(uint *)(local_400.ray + 0x32c) =
                     (uint)bVar24 * iVar45 | (uint)!bVar24 * *(int *)(local_400.ray + 0x32c);
                *(uint *)(local_400.ray + 0x330) =
                     (uint)bVar25 * iVar46 | (uint)!bVar25 * *(int *)(local_400.ray + 0x330);
                *(uint *)(local_400.ray + 0x334) =
                     (uint)bVar26 * iVar47 | (uint)!bVar26 * *(int *)(local_400.ray + 0x334);
                *(uint *)(local_400.ray + 0x338) =
                     (uint)bVar27 * iVar48 | (uint)!bVar27 * *(int *)(local_400.ray + 0x338);
                *(uint *)(local_400.ray + 0x33c) =
                     (uint)bVar28 * iVar49 | (uint)!bVar28 * *(int *)(local_400.ray + 0x33c);
                iVar35 = *(int *)(local_400.hit + 0x44);
                iVar36 = *(int *)(local_400.hit + 0x48);
                iVar37 = *(int *)(local_400.hit + 0x4c);
                iVar38 = *(int *)(local_400.hit + 0x50);
                iVar39 = *(int *)(local_400.hit + 0x54);
                iVar40 = *(int *)(local_400.hit + 0x58);
                iVar41 = *(int *)(local_400.hit + 0x5c);
                iVar42 = *(int *)(local_400.hit + 0x60);
                iVar43 = *(int *)(local_400.hit + 100);
                iVar44 = *(int *)(local_400.hit + 0x68);
                iVar45 = *(int *)(local_400.hit + 0x6c);
                iVar46 = *(int *)(local_400.hit + 0x70);
                iVar47 = *(int *)(local_400.hit + 0x74);
                iVar48 = *(int *)(local_400.hit + 0x78);
                iVar49 = *(int *)(local_400.hit + 0x7c);
                bVar14 = (bool)((byte)(uVar51 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar51 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar51 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar51 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar51 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar51 >> 6) & 1);
                bVar20 = (bool)((byte)(uVar51 >> 7) & 1);
                bVar22 = (bool)((byte)(uVar51 >> 9) & 1);
                bVar23 = (bool)((byte)(uVar51 >> 10) & 1);
                bVar24 = (bool)((byte)(uVar51 >> 0xb) & 1);
                bVar25 = (bool)((byte)(uVar51 >> 0xc) & 1);
                bVar26 = (bool)((byte)(uVar51 >> 0xd) & 1);
                bVar27 = (bool)((byte)(uVar51 >> 0xe) & 1);
                bVar28 = SUB81(uVar51 >> 0xf,0);
                *(uint *)(local_400.ray + 0x340) =
                     (uint)(bVar58 & 1) * *(int *)(local_400.hit + 0x40) |
                     (uint)!(bool)(bVar58 & 1) * *(int *)(local_400.ray + 0x340);
                *(uint *)(local_400.ray + 0x344) =
                     (uint)bVar14 * iVar35 | (uint)!bVar14 * *(int *)(local_400.ray + 0x344);
                *(uint *)(local_400.ray + 0x348) =
                     (uint)bVar15 * iVar36 | (uint)!bVar15 * *(int *)(local_400.ray + 0x348);
                *(uint *)(local_400.ray + 0x34c) =
                     (uint)bVar16 * iVar37 | (uint)!bVar16 * *(int *)(local_400.ray + 0x34c);
                *(uint *)(local_400.ray + 0x350) =
                     (uint)bVar17 * iVar38 | (uint)!bVar17 * *(int *)(local_400.ray + 0x350);
                *(uint *)(local_400.ray + 0x354) =
                     (uint)bVar18 * iVar39 | (uint)!bVar18 * *(int *)(local_400.ray + 0x354);
                *(uint *)(local_400.ray + 0x358) =
                     (uint)bVar19 * iVar40 | (uint)!bVar19 * *(int *)(local_400.ray + 0x358);
                *(uint *)(local_400.ray + 0x35c) =
                     (uint)bVar20 * iVar41 | (uint)!bVar20 * *(int *)(local_400.ray + 0x35c);
                *(uint *)(local_400.ray + 0x360) =
                     (uint)(bVar21 & 1) * iVar42 |
                     (uint)!(bool)(bVar21 & 1) * *(int *)(local_400.ray + 0x360);
                *(uint *)(local_400.ray + 0x364) =
                     (uint)bVar22 * iVar43 | (uint)!bVar22 * *(int *)(local_400.ray + 0x364);
                *(uint *)(local_400.ray + 0x368) =
                     (uint)bVar23 * iVar44 | (uint)!bVar23 * *(int *)(local_400.ray + 0x368);
                *(uint *)(local_400.ray + 0x36c) =
                     (uint)bVar24 * iVar45 | (uint)!bVar24 * *(int *)(local_400.ray + 0x36c);
                *(uint *)(local_400.ray + 0x370) =
                     (uint)bVar25 * iVar46 | (uint)!bVar25 * *(int *)(local_400.ray + 0x370);
                *(uint *)(local_400.ray + 0x374) =
                     (uint)bVar26 * iVar47 | (uint)!bVar26 * *(int *)(local_400.ray + 0x374);
                *(uint *)(local_400.ray + 0x378) =
                     (uint)bVar27 * iVar48 | (uint)!bVar27 * *(int *)(local_400.ray + 0x378);
                *(uint *)(local_400.ray + 0x37c) =
                     (uint)bVar28 * iVar49 | (uint)!bVar28 * *(int *)(local_400.ray + 0x37c);
                iVar35 = *(int *)(local_400.hit + 0x84);
                iVar36 = *(int *)(local_400.hit + 0x88);
                iVar37 = *(int *)(local_400.hit + 0x8c);
                iVar38 = *(int *)(local_400.hit + 0x90);
                iVar39 = *(int *)(local_400.hit + 0x94);
                iVar40 = *(int *)(local_400.hit + 0x98);
                iVar41 = *(int *)(local_400.hit + 0x9c);
                iVar42 = *(int *)(local_400.hit + 0xa0);
                iVar43 = *(int *)(local_400.hit + 0xa4);
                iVar44 = *(int *)(local_400.hit + 0xa8);
                iVar45 = *(int *)(local_400.hit + 0xac);
                iVar46 = *(int *)(local_400.hit + 0xb0);
                iVar47 = *(int *)(local_400.hit + 0xb4);
                iVar48 = *(int *)(local_400.hit + 0xb8);
                iVar49 = *(int *)(local_400.hit + 0xbc);
                bVar14 = (bool)((byte)(uVar51 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar51 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar51 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar51 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar51 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar51 >> 6) & 1);
                bVar20 = (bool)((byte)(uVar51 >> 7) & 1);
                bVar22 = (bool)((byte)(uVar51 >> 9) & 1);
                bVar23 = (bool)((byte)(uVar51 >> 10) & 1);
                bVar24 = (bool)((byte)(uVar51 >> 0xb) & 1);
                bVar25 = (bool)((byte)(uVar51 >> 0xc) & 1);
                bVar26 = (bool)((byte)(uVar51 >> 0xd) & 1);
                bVar27 = (bool)((byte)(uVar51 >> 0xe) & 1);
                bVar28 = SUB81(uVar51 >> 0xf,0);
                *(uint *)(local_400.ray + 0x380) =
                     (uint)(bVar58 & 1) * *(int *)(local_400.hit + 0x80) |
                     (uint)!(bool)(bVar58 & 1) * *(int *)(local_400.ray + 0x380);
                *(uint *)(local_400.ray + 900) =
                     (uint)bVar14 * iVar35 | (uint)!bVar14 * *(int *)(local_400.ray + 900);
                *(uint *)(local_400.ray + 0x388) =
                     (uint)bVar15 * iVar36 | (uint)!bVar15 * *(int *)(local_400.ray + 0x388);
                *(uint *)(local_400.ray + 0x38c) =
                     (uint)bVar16 * iVar37 | (uint)!bVar16 * *(int *)(local_400.ray + 0x38c);
                *(uint *)(local_400.ray + 0x390) =
                     (uint)bVar17 * iVar38 | (uint)!bVar17 * *(int *)(local_400.ray + 0x390);
                *(uint *)(local_400.ray + 0x394) =
                     (uint)bVar18 * iVar39 | (uint)!bVar18 * *(int *)(local_400.ray + 0x394);
                *(uint *)(local_400.ray + 0x398) =
                     (uint)bVar19 * iVar40 | (uint)!bVar19 * *(int *)(local_400.ray + 0x398);
                *(uint *)(local_400.ray + 0x39c) =
                     (uint)bVar20 * iVar41 | (uint)!bVar20 * *(int *)(local_400.ray + 0x39c);
                *(uint *)(local_400.ray + 0x3a0) =
                     (uint)(bVar21 & 1) * iVar42 |
                     (uint)!(bool)(bVar21 & 1) * *(int *)(local_400.ray + 0x3a0);
                *(uint *)(local_400.ray + 0x3a4) =
                     (uint)bVar22 * iVar43 | (uint)!bVar22 * *(int *)(local_400.ray + 0x3a4);
                *(uint *)(local_400.ray + 0x3a8) =
                     (uint)bVar23 * iVar44 | (uint)!bVar23 * *(int *)(local_400.ray + 0x3a8);
                *(uint *)(local_400.ray + 0x3ac) =
                     (uint)bVar24 * iVar45 | (uint)!bVar24 * *(int *)(local_400.ray + 0x3ac);
                *(uint *)(local_400.ray + 0x3b0) =
                     (uint)bVar25 * iVar46 | (uint)!bVar25 * *(int *)(local_400.ray + 0x3b0);
                *(uint *)(local_400.ray + 0x3b4) =
                     (uint)bVar26 * iVar47 | (uint)!bVar26 * *(int *)(local_400.ray + 0x3b4);
                *(uint *)(local_400.ray + 0x3b8) =
                     (uint)bVar27 * iVar48 | (uint)!bVar27 * *(int *)(local_400.ray + 0x3b8);
                *(uint *)(local_400.ray + 0x3bc) =
                     (uint)bVar28 * iVar49 | (uint)!bVar28 * *(int *)(local_400.ray + 0x3bc);
                iVar35 = *(int *)(local_400.hit + 0xc4);
                iVar36 = *(int *)(local_400.hit + 200);
                iVar37 = *(int *)(local_400.hit + 0xcc);
                iVar38 = *(int *)(local_400.hit + 0xd0);
                iVar39 = *(int *)(local_400.hit + 0xd4);
                iVar40 = *(int *)(local_400.hit + 0xd8);
                iVar41 = *(int *)(local_400.hit + 0xdc);
                iVar42 = *(int *)(local_400.hit + 0xe0);
                iVar43 = *(int *)(local_400.hit + 0xe4);
                iVar44 = *(int *)(local_400.hit + 0xe8);
                iVar45 = *(int *)(local_400.hit + 0xec);
                iVar46 = *(int *)(local_400.hit + 0xf0);
                iVar47 = *(int *)(local_400.hit + 0xf4);
                iVar48 = *(int *)(local_400.hit + 0xf8);
                iVar49 = *(int *)(local_400.hit + 0xfc);
                bVar14 = (bool)((byte)(uVar51 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar51 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar51 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar51 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar51 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar51 >> 6) & 1);
                bVar20 = (bool)((byte)(uVar51 >> 7) & 1);
                bVar22 = (bool)((byte)(uVar51 >> 9) & 1);
                bVar23 = (bool)((byte)(uVar51 >> 10) & 1);
                bVar24 = (bool)((byte)(uVar51 >> 0xb) & 1);
                bVar25 = (bool)((byte)(uVar51 >> 0xc) & 1);
                bVar26 = (bool)((byte)(uVar51 >> 0xd) & 1);
                bVar27 = (bool)((byte)(uVar51 >> 0xe) & 1);
                bVar28 = SUB81(uVar51 >> 0xf,0);
                *(uint *)(local_400.ray + 0x3c0) =
                     (uint)(bVar58 & 1) * *(int *)(local_400.hit + 0xc0) |
                     (uint)!(bool)(bVar58 & 1) * *(int *)(local_400.ray + 0x3c0);
                *(uint *)(local_400.ray + 0x3c4) =
                     (uint)bVar14 * iVar35 | (uint)!bVar14 * *(int *)(local_400.ray + 0x3c4);
                *(uint *)(local_400.ray + 0x3c8) =
                     (uint)bVar15 * iVar36 | (uint)!bVar15 * *(int *)(local_400.ray + 0x3c8);
                *(uint *)(local_400.ray + 0x3cc) =
                     (uint)bVar16 * iVar37 | (uint)!bVar16 * *(int *)(local_400.ray + 0x3cc);
                *(uint *)(local_400.ray + 0x3d0) =
                     (uint)bVar17 * iVar38 | (uint)!bVar17 * *(int *)(local_400.ray + 0x3d0);
                *(uint *)(local_400.ray + 0x3d4) =
                     (uint)bVar18 * iVar39 | (uint)!bVar18 * *(int *)(local_400.ray + 0x3d4);
                *(uint *)(local_400.ray + 0x3d8) =
                     (uint)bVar19 * iVar40 | (uint)!bVar19 * *(int *)(local_400.ray + 0x3d8);
                *(uint *)(local_400.ray + 0x3dc) =
                     (uint)bVar20 * iVar41 | (uint)!bVar20 * *(int *)(local_400.ray + 0x3dc);
                *(uint *)(local_400.ray + 0x3e0) =
                     (uint)(bVar21 & 1) * iVar42 |
                     (uint)!(bool)(bVar21 & 1) * *(int *)(local_400.ray + 0x3e0);
                *(uint *)(local_400.ray + 0x3e4) =
                     (uint)bVar22 * iVar43 | (uint)!bVar22 * *(int *)(local_400.ray + 0x3e4);
                *(uint *)(local_400.ray + 1000) =
                     (uint)bVar23 * iVar44 | (uint)!bVar23 * *(int *)(local_400.ray + 1000);
                *(uint *)(local_400.ray + 0x3ec) =
                     (uint)bVar24 * iVar45 | (uint)!bVar24 * *(int *)(local_400.ray + 0x3ec);
                *(uint *)(local_400.ray + 0x3f0) =
                     (uint)bVar25 * iVar46 | (uint)!bVar25 * *(int *)(local_400.ray + 0x3f0);
                *(uint *)(local_400.ray + 0x3f4) =
                     (uint)bVar26 * iVar47 | (uint)!bVar26 * *(int *)(local_400.ray + 0x3f4);
                *(uint *)(local_400.ray + 0x3f8) =
                     (uint)bVar27 * iVar48 | (uint)!bVar27 * *(int *)(local_400.ray + 0x3f8);
                *(uint *)(local_400.ray + 0x3fc) =
                     (uint)bVar28 * iVar49 | (uint)!bVar28 * *(int *)(local_400.ray + 0x3fc);
                iVar35 = *(int *)(local_400.hit + 0x104);
                iVar36 = *(int *)(local_400.hit + 0x108);
                iVar37 = *(int *)(local_400.hit + 0x10c);
                iVar38 = *(int *)(local_400.hit + 0x110);
                iVar39 = *(int *)(local_400.hit + 0x114);
                iVar40 = *(int *)(local_400.hit + 0x118);
                iVar41 = *(int *)(local_400.hit + 0x11c);
                iVar42 = *(int *)(local_400.hit + 0x120);
                iVar43 = *(int *)(local_400.hit + 0x124);
                iVar44 = *(int *)(local_400.hit + 0x128);
                iVar45 = *(int *)(local_400.hit + 300);
                iVar46 = *(int *)(local_400.hit + 0x130);
                iVar47 = *(int *)(local_400.hit + 0x134);
                iVar48 = *(int *)(local_400.hit + 0x138);
                iVar49 = *(int *)(local_400.hit + 0x13c);
                bVar14 = (bool)((byte)(uVar51 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar51 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar51 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar51 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar51 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar51 >> 6) & 1);
                bVar20 = (bool)((byte)(uVar51 >> 7) & 1);
                bVar22 = (bool)((byte)(uVar51 >> 9) & 1);
                bVar23 = (bool)((byte)(uVar51 >> 10) & 1);
                bVar24 = (bool)((byte)(uVar51 >> 0xb) & 1);
                bVar25 = (bool)((byte)(uVar51 >> 0xc) & 1);
                bVar26 = (bool)((byte)(uVar51 >> 0xd) & 1);
                bVar27 = (bool)((byte)(uVar51 >> 0xe) & 1);
                bVar28 = SUB81(uVar51 >> 0xf,0);
                *(uint *)(local_400.ray + 0x400) =
                     (uint)(bVar58 & 1) * *(int *)(local_400.hit + 0x100) |
                     (uint)!(bool)(bVar58 & 1) * *(int *)(local_400.ray + 0x400);
                *(uint *)(local_400.ray + 0x404) =
                     (uint)bVar14 * iVar35 | (uint)!bVar14 * *(int *)(local_400.ray + 0x404);
                *(uint *)(local_400.ray + 0x408) =
                     (uint)bVar15 * iVar36 | (uint)!bVar15 * *(int *)(local_400.ray + 0x408);
                *(uint *)(local_400.ray + 0x40c) =
                     (uint)bVar16 * iVar37 | (uint)!bVar16 * *(int *)(local_400.ray + 0x40c);
                *(uint *)(local_400.ray + 0x410) =
                     (uint)bVar17 * iVar38 | (uint)!bVar17 * *(int *)(local_400.ray + 0x410);
                *(uint *)(local_400.ray + 0x414) =
                     (uint)bVar18 * iVar39 | (uint)!bVar18 * *(int *)(local_400.ray + 0x414);
                *(uint *)(local_400.ray + 0x418) =
                     (uint)bVar19 * iVar40 | (uint)!bVar19 * *(int *)(local_400.ray + 0x418);
                *(uint *)(local_400.ray + 0x41c) =
                     (uint)bVar20 * iVar41 | (uint)!bVar20 * *(int *)(local_400.ray + 0x41c);
                *(uint *)(local_400.ray + 0x420) =
                     (uint)(bVar21 & 1) * iVar42 |
                     (uint)!(bool)(bVar21 & 1) * *(int *)(local_400.ray + 0x420);
                *(uint *)(local_400.ray + 0x424) =
                     (uint)bVar22 * iVar43 | (uint)!bVar22 * *(int *)(local_400.ray + 0x424);
                *(uint *)(local_400.ray + 0x428) =
                     (uint)bVar23 * iVar44 | (uint)!bVar23 * *(int *)(local_400.ray + 0x428);
                *(uint *)(local_400.ray + 0x42c) =
                     (uint)bVar24 * iVar45 | (uint)!bVar24 * *(int *)(local_400.ray + 0x42c);
                *(uint *)(local_400.ray + 0x430) =
                     (uint)bVar25 * iVar46 | (uint)!bVar25 * *(int *)(local_400.ray + 0x430);
                *(uint *)(local_400.ray + 0x434) =
                     (uint)bVar26 * iVar47 | (uint)!bVar26 * *(int *)(local_400.ray + 0x434);
                *(uint *)(local_400.ray + 0x438) =
                     (uint)bVar27 * iVar48 | (uint)!bVar27 * *(int *)(local_400.ray + 0x438);
                *(uint *)(local_400.ray + 0x43c) =
                     (uint)bVar28 * iVar49 | (uint)!bVar28 * *(int *)(local_400.ray + 0x43c);
                auVar68 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_400.hit + 0x140));
                auVar68 = vmovdqu32_avx512f(auVar68);
                *(undefined1 (*) [64])(local_400.ray + 0x440) = auVar68;
                auVar68 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_400.hit + 0x180));
                auVar68 = vmovdqu32_avx512f(auVar68);
                *(undefined1 (*) [64])(local_400.ray + 0x480) = auVar68;
                auVar68 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_400.hit + 0x1c0));
                auVar68 = vmovdqa32_avx512f(auVar68);
                *(undefined1 (*) [64])(local_400.ray + 0x4c0) = auVar68;
                auVar68 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_400.hit + 0x200));
                auVar65 = auVar68._0_16_;
                auVar68 = vmovdqa32_avx512f(auVar68);
                *(undefined1 (*) [64])(local_400.ray + 0x500) = auVar68;
              }
              uVar83 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar34._4_4_ = uVar83;
              auVar34._0_4_ = uVar83;
              auVar34._8_4_ = uVar83;
              auVar34._12_4_ = uVar83;
              uVar31 = vcmpps_avx512vl(auVar92._0_16_,auVar34,2);
              bVar58 = ~(byte)(1 << (uVar50 & 0x1f)) & (byte)uVar59 & (byte)uVar31;
              goto LAB_01bd3de7;
            }
            bVar14 = false;
          }
          if (!bVar14) {
            uVar51 = (ulong)(uVar56 << 2);
            uVar83 = *(undefined4 *)(local_3c0 + uVar51);
            uVar5 = *(undefined4 *)(local_3c0 + uVar51 + 0x10);
            *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_3a0 + uVar51);
            *(undefined4 *)(ray + k * 4 + 0x300) = *(undefined4 *)((long)local_390 + uVar51);
            *(undefined4 *)(ray + k * 4 + 0x340) = *(undefined4 *)((long)local_380 + uVar51);
            *(undefined4 *)(ray + k * 4 + 0x380) = *(undefined4 *)((long)local_370 + uVar51);
            *(undefined4 *)(ray + k * 4 + 0x3c0) = uVar83;
            *(undefined4 *)(ray + k * 4 + 0x400) = uVar5;
            *(undefined4 *)(ray + k * 4 + 0x440) =
                 *(undefined4 *)((long)&(Disc->primIDs).field_0 + uVar51);
            *(uint *)(ray + k * 4 + 0x480) = uVar52;
            *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
            return;
          }
          bVar58 = (byte)uVar59;
          if (bVar58 == 0) {
            return;
          }
          auVar66 = vblendmps_avx512vl(auVar78._0_16_,auVar92._0_16_);
          auVar67._0_4_ =
               (uint)(bVar58 & 1) * auVar66._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar65._0_4_;
          bVar14 = (bool)((byte)(uVar59 >> 1) & 1);
          auVar67._4_4_ = (uint)bVar14 * auVar66._4_4_ | (uint)!bVar14 * auVar65._4_4_;
          bVar14 = (bool)((byte)(uVar59 >> 2) & 1);
          auVar67._8_4_ = (uint)bVar14 * auVar66._8_4_ | (uint)!bVar14 * auVar65._8_4_;
          auVar67._12_4_ =
               (uVar59 >> 3) * auVar66._12_4_ | (uint)!SUB41(uVar59 >> 3,0) * auVar65._12_4_;
          auVar66 = vshufps_avx(auVar67,auVar67,0xb1);
          auVar66 = vminps_avx(auVar66,auVar67);
          auVar64 = vshufpd_avx(auVar66,auVar66,1);
          auVar66 = vminps_avx(auVar64,auVar66);
          uVar31 = vcmpps_avx512vl(auVar67,auVar66,0);
          bVar58 = (byte)uVar31 & bVar58;
          uVar52 = uVar59;
          if (bVar58 != 0) {
            uVar52 = (uint)bVar58;
          }
          uVar50 = 0;
          for (; auVar65 = auVar67, (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x80000000) {
            uVar50 = uVar50 + 1;
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }